

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O2

void __thiscall
lts2::LBDOperator::drawBasis
          (LBDOperator *this,vector<cv::Mat,_std::allocator<cv::Mat>_> *basisFunctions,int normalize
          )

{
  _InputArray *p_Var1;
  long lVar2;
  int i;
  ulong uVar3;
  _OutputArray local_c0;
  _InputArray local_a8;
  Mat negPart;
  
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::resize
            (basisFunctions,(ulong)*(uint *)&(this->super_LinearOperator).field_0xc);
  cv::Mat::Mat(&negPart);
  lVar2 = 0;
  uVar3 = 0;
  do {
    if (*(uint *)&(this->super_LinearOperator).field_0xc <= uVar3) {
      cv::Mat::~Mat(&negPart);
      return;
    }
    fillBasisFunctionForIndex(this,(Mat *)(*(long *)basisFunctions + lVar2),(int)uVar3);
    if (normalize < 1) {
      if (normalize != 0) goto LAB_00104088;
    }
    else {
      local_a8.sz.width = 0;
      local_a8.sz.height = 0;
      local_a8.obj = (void *)(*(long *)basisFunctions + lVar2);
      local_c0.super__InputArray.sz.width = 0;
      local_c0.super__InputArray.sz.height = 0;
      local_a8.flags = 0x1010000;
      local_c0.super__InputArray.flags = 0x2010000;
      local_c0.super__InputArray.obj = &negPart;
      cv::threshold(&local_a8,&local_c0,-1.1754943508222875e-38,-1.0,1);
      local_a8.sz.width = 0;
      local_a8.sz.height = 0;
      local_c0.super__InputArray.obj = (void *)(*(long *)basisFunctions + lVar2);
      local_c0.super__InputArray.sz.width = 0;
      local_c0.super__InputArray.sz.height = 0;
      local_a8.flags = 0x1010000;
      local_c0.super__InputArray.flags = 0x2010000;
      local_a8.obj = local_c0.super__InputArray.obj;
      cv::threshold(&local_a8,&local_c0,1.1754943508222875e-38,1.0,0);
      cv::operator+=((Mat *)(*(long *)basisFunctions + lVar2),&negPart);
LAB_00104088:
      local_a8.sz.width = 0;
      local_a8.sz.height = 0;
      local_c0.super__InputArray.obj = (void *)(*(long *)basisFunctions + lVar2);
      local_c0.super__InputArray.sz.width = 0;
      local_c0.super__InputArray.sz.height = 0;
      local_a8.flags = 0x1010000;
      local_c0.super__InputArray.flags = 0x3010000;
      local_a8.obj = local_c0.super__InputArray.obj;
      p_Var1 = (_InputArray *)cv::noArray();
      cv::normalize(&local_a8,(_InputOutputArray *)&local_c0,0.0,1.0,0x20,-1,p_Var1);
    }
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x60;
  } while( true );
}

Assistant:

void lts2::LBDOperator::drawBasis(std::vector<cv::Mat> &basisFunctions, int normalize) const
{
  basisFunctions.resize(_pairsInUse);
  cv::Mat negPart;

  for (int i = 0; i < _pairsInUse; ++i)
  {
    this->fillBasisFunctionForIndex(basisFunctions[i], i);

    if (normalize > 0) {
      cv::threshold(basisFunctions[i], negPart, -FLT_MIN, -1.0, cv::THRESH_BINARY_INV);
      cv::threshold(basisFunctions[i], basisFunctions[i], FLT_MIN, 1.0, cv::THRESH_BINARY);
      basisFunctions[i] += negPart;
    }
    if (normalize != 0) cv::normalize(basisFunctions[i], basisFunctions[i], 0.0, 1.0, cv::NORM_MINMAX);
  }
}